

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

anytype_t * ps_config_get(ps_config_t *config,char *name)

{
  int32 iVar1;
  ps_config_t *local_28;
  void *val;
  char *name_local;
  ps_config_t *config_local;
  
  val = name;
  name_local = (char *)config;
  iVar1 = hash_table_lookup(config->ht,name,&local_28);
  if (iVar1 < 0) {
    config_local = (ps_config_t *)0x0;
  }
  else if (local_28 == (ps_config_t *)0x0) {
    config_local = (ps_config_t *)0x0;
  }
  else {
    config_local = local_28;
  }
  return (anytype_t *)config_local;
}

Assistant:

const anytype_t *
ps_config_get(ps_config_t *config, const char *name)
{
    void *val;
    if (hash_table_lookup(config->ht, name, &val) < 0)
        return NULL;
    if (val == NULL)
        return NULL;
    return &((cmd_ln_val_t *)val)->val;
}